

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O0

void process_twin_subscription(TWIN_MESSENGER_INSTANCE_conflict *twin_msgr)

{
  char *pcVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  TWIN_OPERATION_CONTEXT *twin_op_ctx_00;
  char *pcVar4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  TWIN_OPERATION_CONTEXT *twin_op_ctx;
  TWIN_SUBSCRIPTION_STATE next_subscription_state;
  TWIN_OPERATION_TYPE op_type;
  LOGGER_LOG l;
  TWIN_MESSENGER_INSTANCE_conflict *twin_msgr_local;
  
  if (twin_msgr->subscription_error_count < 3) {
    twin_op_ctx._4_4_ = TWIN_OPERATION_TYPE_PATCH;
    twin_op_ctx._0_4_ = twin_msgr->subscription_state;
    if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_GET_COMPLETE_PROPERTIES) {
      twin_op_ctx._4_4_ = TWIN_OPERATION_TYPE_GET;
      twin_op_ctx._0_4_ = TWIN_SUBSCRIPTION_STATE_GETTING_COMPLETE_PROPERTIES;
    }
    else if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_SUBSCRIBE_FOR_UPDATES) {
      twin_op_ctx._4_4_ = TWIN_OPERATION_TYPE_PUT;
      twin_op_ctx._0_4_ = TWIN_SUBSCRIPTION_STATE_SUBSCRIBING;
    }
    else if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_UNSUBSCRIBE) {
      twin_op_ctx._4_4_ = TWIN_OPERATION_TYPE_PUT;
      twin_op_ctx._0_4_ = TWIN_SUBSCRIPTION_STATE_UNSUBSCRIBING;
    }
    if ((TWIN_SUBSCRIPTION_STATE)twin_op_ctx != twin_msgr->subscription_state) {
      twin_op_ctx_00 = create_twin_operation_context(twin_msgr,twin_op_ctx._4_4_);
      if (twin_op_ctx_00 == (TWIN_OPERATION_CONTEXT *)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar1 = twin_msgr->device_id;
          pcVar4 = TWIN_OPERATION_TYPEStrings(twin_op_ctx._4_4_);
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"process_twin_subscription",0x4b8,1,
                    "Failed creating a context for TWIN request (%s, %s)",pcVar1,pcVar4);
        }
        update_state(twin_msgr,TWIN_MESSENGER_STATE_ERROR);
      }
      else {
        iVar2 = add_twin_operation_context_to_queue(twin_op_ctx_00);
        if (iVar2 == 0) {
          iVar2 = send_twin_operation_request(twin_msgr,twin_op_ctx_00,(CONSTBUFFER_HANDLE)0x0);
          if (iVar2 == 0) {
            twin_msgr->subscription_state = (TWIN_SUBSCRIPTION_STATE)twin_op_ctx;
          }
          else {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              pcVar1 = twin_msgr->device_id;
              pcVar4 = TWIN_OPERATION_TYPEStrings(twin_op_ctx._4_4_);
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"process_twin_subscription",0x4c5,1,"Failed sending TWIN request (%s, %s)",
                        pcVar1,pcVar4);
            }
            remove_twin_operation_context_from_queue(twin_op_ctx_00);
            destroy_twin_operation_context(twin_op_ctx_00);
            update_state(twin_msgr,TWIN_MESSENGER_STATE_ERROR);
          }
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar1 = twin_msgr->device_id;
            pcVar4 = TWIN_OPERATION_TYPEStrings(twin_op_ctx._4_4_);
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"process_twin_subscription",0x4bf,1,
                      "Failed queueing TWIN request context (%s, %s)",pcVar1,pcVar4);
          }
          destroy_twin_operation_context(twin_op_ctx_00);
          update_state(twin_msgr,TWIN_MESSENGER_STATE_ERROR);
        }
      }
    }
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"process_twin_subscription",0x49a,1,
                "Maximum number of TWIN subscription-related failures reached (%s, %lu)",
                twin_msgr->device_id,twin_msgr->subscription_error_count);
    }
    update_state(twin_msgr,TWIN_MESSENGER_STATE_ERROR);
  }
  return;
}

Assistant:

static void process_twin_subscription(TWIN_MESSENGER_INSTANCE* twin_msgr)
{
    if (twin_msgr->subscription_error_count >= DEFAULT_MAX_TWIN_SUBSCRIPTION_ERROR_COUNT)
    {
        LogError("Maximum number of TWIN subscription-related failures reached (%s, %lu)", twin_msgr->device_id, (unsigned long)twin_msgr->subscription_error_count);
        update_state(twin_msgr, TWIN_MESSENGER_STATE_ERROR);
    }
    else
    {
        TWIN_OPERATION_TYPE op_type = TWIN_OPERATION_TYPE_PATCH;
        TWIN_SUBSCRIPTION_STATE next_subscription_state = twin_msgr->subscription_state;

        if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_GET_COMPLETE_PROPERTIES)
        {
            op_type = TWIN_OPERATION_TYPE_GET;
            next_subscription_state = TWIN_SUBSCRIPTION_STATE_GETTING_COMPLETE_PROPERTIES;
        }
        else if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_SUBSCRIBE_FOR_UPDATES)
        {
            op_type = TWIN_OPERATION_TYPE_PUT;
            next_subscription_state = TWIN_SUBSCRIPTION_STATE_SUBSCRIBING;
        }
        else if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_UNSUBSCRIBE)
        {
            op_type = TWIN_OPERATION_TYPE_PUT;
            next_subscription_state = TWIN_SUBSCRIPTION_STATE_UNSUBSCRIBING;
        }

        if (next_subscription_state != twin_msgr->subscription_state)
        {
            TWIN_OPERATION_CONTEXT* twin_op_ctx;

            if ((twin_op_ctx = create_twin_operation_context(twin_msgr, op_type)) == NULL)
            {
                LogError("Failed creating a context for TWIN request (%s, %s)", twin_msgr->device_id, MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, op_type));
                update_state(twin_msgr, TWIN_MESSENGER_STATE_ERROR);
            }
            else
            {
                if (add_twin_operation_context_to_queue(twin_op_ctx) != RESULT_OK)
                {
                    LogError("Failed queueing TWIN request context (%s, %s)", twin_msgr->device_id, MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, op_type));
                    destroy_twin_operation_context(twin_op_ctx);
                    update_state(twin_msgr, TWIN_MESSENGER_STATE_ERROR);
                }
                else if (send_twin_operation_request(twin_msgr, twin_op_ctx, NULL) != RESULT_OK)
                {
                    LogError("Failed sending TWIN request (%s, %s)", twin_msgr->device_id, MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, op_type));

                    (void)remove_twin_operation_context_from_queue(twin_op_ctx);
                    destroy_twin_operation_context(twin_op_ctx);
                    update_state(twin_msgr, TWIN_MESSENGER_STATE_ERROR);
                }
                else
                {
                    twin_msgr->subscription_state = next_subscription_state;
                }
            }
        }
    }
}